

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall TestDiagnosticInternal::Run(TestDiagnosticInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>,_int>_>
  *in_RDX;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_std::ios_base_&(*)(std::ios_base_&)>,_int>_>
  *extraout_RDX;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_std::ios_base_&(*)(std::ios_base_&)>,_int>_>
  *extraout_RDX_00;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_std::ios_base_&(*)(std::ios_base_&)>,_int>_>
  *t;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [32];
  undefined4 local_28;
  
  pOVar1 = (this->super_Test).m_op;
  local_48._8_8_ = "Hello world ";
  local_48._16_4_ = 0x2a;
  local_48._24_8_ = std::endl<char,std::char_traits<char>>;
  local_28 = 0x2a;
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,std::ostream&(*)(std::ostream&)>,int>>>
            ((string *)local_68,(testinator *)local_48,in_RDX);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,local_68);
  t = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
    t = extraout_RDX_00;
  }
  pOVar1 = (this->super_Test).m_op;
  local_68._8_8_ = "Hello world ";
  local_58._M_allocated_capacity = (size_type)std::hex;
  local_58._8_4_ = 0x2a;
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,std::ios_base&(*)(std::ios_base&)>,int>>>
            ((string *)local_48,(testinator *)local_68,t);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,(string *)local_48);
  if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
    operator_delete((void *)local_48._0_8_,CONCAT44(local_48._20_4_,local_48._16_4_) + 1);
  }
  return true;
}

Assistant:

virtual bool Run()
  {
    DIAGNOSTIC("Hello world " << 42 << endl << 42);
    DIAGNOSTIC("Hello world " << std::hex << 42);
    return true;
  }